

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

char * __thiscall bloaty::Regex::_InternalParse(Regex *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  EpsCopyInputStream *in_RDX;
  string *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  HasBits has_bits;
  char **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  ParseContext *p;
  
  p = in_RDI;
  memset(&stack0xffffffffffffffd4,0,4);
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done
                        ((ParseContext *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a88e4;
      in_RSI = (string *)
               google::protobuf::internal::ReadTag
                         ((char *)p,(uint32 *)in_RSI,(uint32)((ulong)in_RDX >> 0x20));
      if (in_RSI == (string *)0x0) goto LAB_001a8901;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffd0 >> 3;
      if (in_stack_ffffffffffffffc4 != 1) break;
      if ((in_stack_ffffffffffffffd0 & 0xff) == 10) {
        _internal_mutable_pattern_abi_cxx11_((Regex *)CONCAT44(1,in_stack_ffffffffffffffc0));
        in_RSI = (string *)
                 google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                           (in_RSI,(char *)in_RDX,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)in_RDI);
      }
      else {
LAB_001a8886:
        if (((in_stack_ffffffffffffffd0 & 7) == 4) || (in_stack_ffffffffffffffd0 == 0)) {
          google::protobuf::internal::EpsCopyInputStream::SetLastTag
                    (in_RDX,in_stack_ffffffffffffffd0);
          goto LAB_001a88e4;
        }
        in_RSI = (string *)
                 google::protobuf::internal::UnknownFieldParse
                           ((uint32)((ulong)in_RSI >> 0x20),(InternalMetadataWithArena *)in_RDX,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                             in_stack_ffffffffffffffd0),in_RDI);
      }
      if (in_RSI == (string *)0x0) goto LAB_001a8901;
    }
    if ((in_stack_ffffffffffffffc4 != 2) || ((in_stack_ffffffffffffffd0 & 0xff) != 0x12))
    goto LAB_001a8886;
    _internal_mutable_replacement_abi_cxx11_((Regex *)CONCAT44(2,in_stack_ffffffffffffffc0));
    in_RSI = (string *)
             google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                       (in_RSI,(char *)in_RDX,
                        (ParseContext *)
                        CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],in_stack_ffffffffffffffd0),
                        (char *)in_RDI);
  } while (in_RSI != (string *)0x0);
LAB_001a8901:
  in_RSI = (string *)0x0;
LAB_001a88e4:
  google::protobuf::internal::HasBits<1UL>::Or
            ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
             (HasBits<1UL> *)&stack0xffffffffffffffd4);
  return (char *)in_RSI;
}

Assistant:

const char* Regex::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string pattern = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_pattern(), ptr, ctx, "bloaty.Regex.pattern");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string replacement = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_replacement(), ptr, ctx, "bloaty.Regex.replacement");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}